

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O3

int ffomem(fitsfile **fptr,char *name,int mode,void **buffptr,size_t *buffsize,size_t deltasize,
          _func_void_ptr_void_ptr_size_t *mem_realloc,int *status)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  fitsfile *pfVar4;
  FITSfile *pFVar5;
  size_t sVar6;
  LONGLONG *pLVar7;
  char *pcVar8;
  long lVar9;
  fitsfile **ppfVar10;
  char *pcVar11;
  uint uVar12;
  ulong uVar13;
  _func_int_int **pp_Var14;
  _func_int_int **pp_Var15;
  char *pcVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int handle;
  int extvers;
  int movetotype;
  int extnum;
  int hdutyp;
  LONGLONG filesize;
  char extname [71];
  char urltype [20];
  char errmsg [81];
  char imagecolname [71];
  char extspec [1025];
  char rowexpress [1025];
  char colspec [1025];
  char binspec [1025];
  char rowfilter [1025];
  char outfile [1025];
  char infile [1025];
  int local_1dfc;
  fitsfile **local_1df8;
  int local_1dec;
  int local_1de8;
  int local_1de4;
  uint local_1de0;
  int local_1ddc;
  size_t *local_1dd8;
  size_t local_1dd0;
  void **local_1dc8;
  LONGLONG local_1dc0;
  char local_1db8 [80];
  char local_1d68 [32];
  char local_1d48 [96];
  char local_1ce8 [80];
  char local_1c98 [1040];
  char local_1888 [1040];
  char local_1478 [1040];
  char local_1068 [1040];
  char local_c58 [1040];
  char local_848 [1040];
  char local_438 [1032];
  
  if (0 < *status) {
    return *status;
  }
  *fptr = (fitsfile *)0x0;
  local_1dc8 = buffptr;
  if (need_to_initialize != 0) {
    iVar2 = fits_init_cfitsio();
    *status = iVar2;
    if (0 < iVar2) {
      return iVar2;
    }
  }
  pcVar16 = name + -1;
  do {
    pcVar11 = pcVar16 + 1;
    pcVar16 = pcVar16 + 1;
  } while (*pcVar11 == ' ');
  local_1df8 = fptr;
  local_1de4 = mode;
  local_1dd8 = buffsize;
  local_1dd0 = deltasize;
  ffifile2(pcVar16,local_1d68,local_438,local_848,local_1c98,local_c58,local_1068,local_1478,
           (char *)0x0,(char *)0x0,status);
  builtin_strncpy(local_1d68,"memkeep://",0xb);
  uVar13 = (ulong)(uint)no_of_drivers;
  pcVar11 = (char *)((long)ngp_tkdef + uVar13 * 0x98 + 0x18);
  pp_Var15 = &driverTable[(long)(no_of_drivers + -1) + 1].close;
  do {
    pp_Var14 = pp_Var15;
    if ((int)uVar13 < 1) {
      *status = 0x7c;
      ffpmsg("could not find driver for pre-existing memory file: (ffomem)");
      return *status;
    }
    iVar2 = strcmp(pcVar11,local_1d68);
    pp_Var15 = pp_Var14 + -0x13;
    uVar12 = (int)uVar13 - 1;
    uVar13 = (ulong)uVar12;
    pcVar11 = pcVar11 + -0x98;
  } while (iVar2 != 0);
  *status = 0;
  iVar2 = mem_openmem(local_1dc8,local_1dd8,local_1dd0,mem_realloc,&local_1dfc);
  *status = iVar2;
  if (iVar2 < 1) {
    iVar2 = (*pp_Var14[-0x11])(local_1dfc,&local_1dc0);
    *status = iVar2;
    if (iVar2 < 1) {
      pfVar4 = (fitsfile *)calloc(1,0x10);
      *local_1df8 = pfVar4;
      if (pfVar4 == (fitsfile *)0x0) {
        (**pp_Var15)(local_1dfc);
        ffpmsg("failed to allocate structure for following file: (ffomem)");
        ffpmsg(pcVar16);
      }
      else {
        pFVar5 = (FITSfile *)calloc(1,0x7e8);
        pfVar4->Fptr = pFVar5;
        if (pFVar5 != (FITSfile *)0x0) {
          sVar6 = strlen(pcVar16);
          uVar3 = (int)sVar6 + 1;
          sVar6 = 0x20;
          if (0x20 < (int)uVar3) {
            sVar6 = (size_t)uVar3;
          }
          pcVar11 = (char *)malloc(sVar6);
          pFVar5->filename = pcVar11;
          if (pcVar11 == (char *)0x0) {
            (**pp_Var15)(local_1dfc);
            ffpmsg("failed to allocate memory for filename: (ffomem)");
            ffpmsg(pcVar16);
            ppfVar10 = local_1df8;
          }
          else {
            pLVar7 = (LONGLONG *)calloc(0x3e9,8);
            pFVar5->headstart = pLVar7;
            if (pLVar7 == (LONGLONG *)0x0) {
              (**pp_Var15)(local_1dfc);
              ffpmsg("failed to allocate memory for headstart array: (ffomem)");
              ffpmsg(pcVar16);
              ppfVar10 = local_1df8;
            }
            else {
              pcVar8 = (char *)calloc(0x28,0xb40);
              pFVar5->iobuffer = pcVar8;
              if (pcVar8 != (char *)0x0) {
                memset(pFVar5->bufrecnum,0xff,0x140);
                iVar2 = 0;
                iVar17 = 1;
                iVar18 = 2;
                iVar19 = 3;
                lVar9 = 0x1d2;
                do {
                  piVar1 = &pFVar5->filehandle + lVar9;
                  *piVar1 = iVar2;
                  piVar1[1] = iVar17;
                  piVar1[2] = iVar18;
                  piVar1[3] = iVar19;
                  iVar2 = iVar2 + 4;
                  iVar17 = iVar17 + 4;
                  iVar18 = iVar18 + 4;
                  iVar19 = iVar19 + 4;
                  lVar9 = lVar9 + 4;
                } while (lVar9 != 0x1fa);
                pFVar5->MAXHDU = 1000;
                pFVar5->filehandle = local_1dfc;
                pFVar5->driver = uVar12;
                strcpy(pcVar11,pcVar16);
                pFVar5->filesize = local_1dc0;
                pFVar5->logfilesize = local_1dc0;
                pFVar5->writemode = local_1de4;
                pFVar5->datastart = -1;
                pFVar5->curbuf = -1;
                pFVar5->open_count = 1;
                pFVar5->validcode = 0x22b;
                pFVar5->noextsyntax = 0;
                ffldrc(pfVar4,0,0,status);
                ppfVar10 = local_1df8;
                pfVar4 = *local_1df8;
                if (*status < 1) {
                  lVar9 = 0;
                  do {
                    if (*(long *)((long)FptrTable + lVar9) == 0) {
                      *(FITSfile **)((long)FptrTable + lVar9) = pfVar4->Fptr;
                      pfVar4 = *local_1df8;
                      break;
                    }
                    lVar9 = lVar9 + 8;
                  } while (lVar9 != 80000);
                }
                iVar2 = ffrhdu(pfVar4,&local_1ddc,status);
                if (0 < iVar2) {
                  ffpmsg("ffomem could not interpret primary array header of file: (ffomem)");
                  ffpmsg(pcVar16);
                  if (*status == 0xfc) {
                    ffpmsg("This does not look like a FITS file.");
                  }
                  ffclos(*ppfVar10,status);
                  *ppfVar10 = (fitsfile *)0x0;
                }
                local_1ce8[0] = '\0';
                local_1888[0] = '\0';
                if (local_1c98[0] != '\0') {
                  ffexts(local_1c98,(int *)&local_1de0,local_1db8,&local_1dec,&local_1de8,local_1ce8
                         ,local_1888,status);
                  if (0 < *status) {
                    return *status;
                  }
                  if (local_1de0 == 0) {
                    if (local_1db8[0] != '\0') {
                      ffmnhd(*ppfVar10,local_1de8,local_1db8,local_1dec,status);
                    }
                  }
                  else {
                    ffmahd(*ppfVar10,local_1de0 + 1,&local_1ddc,status);
                  }
                  if (*status < 1) {
                    return *status;
                  }
                  ffpmsg("ffomem could not move to the specified extension:");
                  if ((int)local_1de0 < 1) {
                    snprintf(local_1d48,0x51," extension with EXTNAME = %s,",local_1db8);
                    ffpmsg(local_1d48);
                    if (local_1dec != 0) {
                      snprintf(local_1d48,0x51,"           and with EXTVERS = %d,");
                      ffpmsg(local_1d48);
                    }
                    pcVar16 = " doesn\'t exist or couldn\'t be opened.";
                    if ((long)local_1de8 != -1) {
                      snprintf(local_1d48,0x51,"           and with XTENSION = %s,",
                               *(undefined8 *)(&DAT_001f4ae0 + (long)local_1de8 * 8));
                      ffpmsg(local_1d48);
                    }
                  }
                  else {
                    pcVar16 = local_1d48;
                    snprintf(pcVar16,0x51,
                             " extension number %d doesn\'t exist or couldn\'t be opened.",
                             (ulong)local_1de0);
                  }
                  ffpmsg(pcVar16);
                }
                return *status;
              }
              (**pp_Var15)(local_1dfc);
              ffpmsg("failed to allocate memory for iobuffer array: (ffomem)");
              ffpmsg(pcVar16);
              ppfVar10 = local_1df8;
              free((*local_1df8)->Fptr->headstart);
            }
            free((*ppfVar10)->Fptr->filename);
          }
          free((*ppfVar10)->Fptr);
          free(*ppfVar10);
          *ppfVar10 = (fitsfile *)0x0;
          *status = 0x71;
          return 0x71;
        }
        (**pp_Var15)(local_1dfc);
        ffpmsg("failed to allocate structure for following file: (ffomem)");
        ffpmsg(pcVar16);
        ppfVar10 = local_1df8;
        free(*local_1df8);
        *ppfVar10 = (fitsfile *)0x0;
      }
      *status = 0x71;
      return 0x71;
    }
    (**pp_Var15)(local_1dfc);
    pcVar16 = "failed get the size of the memory file: (ffomem)";
  }
  else {
    pcVar16 = "failed to open pre-existing memory file: (ffomem)";
  }
  ffpmsg(pcVar16);
  return *status;
}

Assistant:

int ffomem(fitsfile **fptr,      /* O - FITS file pointer                   */ 
           const char *name,     /* I - name of file to open                */
           int mode,             /* I - 0 = open readonly; 1 = read/write   */
           void **buffptr,       /* I - address of memory pointer           */
           size_t *buffsize,     /* I - size of buffer, in bytes            */
           size_t deltasize,     /* I - increment for future realloc's      */
           void *(*mem_realloc)(void *p, size_t newsize), /* function       */
           int *status)          /* IO - error status                       */
/*
  Open an existing FITS file in core memory.  This is a specialized version
  of ffopen.
*/
{
    int ii, driver, handle, hdutyp, slen, movetotype, extvers, extnum;
    char extname[FLEN_VALUE];
    LONGLONG filesize;
    char urltype[MAX_PREFIX_LEN], infile[FLEN_FILENAME], outfile[FLEN_FILENAME];
    char extspec[FLEN_FILENAME], rowfilter[FLEN_FILENAME];
    char binspec[FLEN_FILENAME], colspec[FLEN_FILENAME];
    char imagecolname[FLEN_VALUE], rowexpress[FLEN_FILENAME];
    char *url, errmsg[FLEN_ERRMSG];
    char *hdtype[3] = {"IMAGE", "TABLE", "BINTABLE"};

    if (*status > 0)
        return(*status);

    *fptr = 0;                   /* initialize null file pointer */

    if (need_to_initialize)           /* this is called only once */
    {
        *status = fits_init_cfitsio();

        if (*status > 0)
            return(*status);
    }

    url = (char *) name;
    while (*url == ' ')  /* ignore leading spaces in the file spec */
        url++;

        /* parse the input file specification */
    fits_parse_input_url(url, urltype, infile, outfile, extspec,
              rowfilter, binspec, colspec, status);

    strcpy(urltype, "memkeep://");   /* URL type for pre-existing memory file */

    *status = urltype2driver(urltype, &driver);

    if (*status > 0)
    {
        ffpmsg("could not find driver for pre-existing memory file: (ffomem)");
        return(*status);
    }

    /* call driver routine to open the memory file */
    FFLOCK;  /* lock this while searching for vacant handle */
    *status =   mem_openmem( buffptr, buffsize,deltasize,
                            mem_realloc,  &handle);
    FFUNLOCK;

    if (*status > 0)
    {
         ffpmsg("failed to open pre-existing memory file: (ffomem)");
         return(*status);
    }

        /* get initial file size */
    *status = (*driverTable[driver].size)(handle, &filesize);

    if (*status > 0)
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed get the size of the memory file: (ffomem)");
        return(*status);
    }

        /* allocate fitsfile structure and initialize = 0 */
    *fptr = (fitsfile *) calloc(1, sizeof(fitsfile));

    if (!(*fptr))
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate structure for following file: (ffomem)");
        ffpmsg(url);
        return(*status = MEMORY_ALLOCATION);
    }

        /* allocate FITSfile structure and initialize = 0 */
    (*fptr)->Fptr = (FITSfile *) calloc(1, sizeof(FITSfile));

    if (!((*fptr)->Fptr))
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate structure for following file: (ffomem)");
        ffpmsg(url);
        free(*fptr);
        *fptr = 0;       
        return(*status = MEMORY_ALLOCATION);
    }

    slen = strlen(url) + 1;
    slen = maxvalue(slen, 32); /* reserve at least 32 chars */ 
    ((*fptr)->Fptr)->filename = (char *) malloc(slen); /* mem for file name */

    if ( !(((*fptr)->Fptr)->filename) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for filename: (ffomem)");
        ffpmsg(url);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* mem for headstart array */
    ((*fptr)->Fptr)->headstart = (LONGLONG *) calloc(1001, sizeof(LONGLONG)); 

    if ( !(((*fptr)->Fptr)->headstart) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for headstart array: (ffomem)");
        ffpmsg(url);
        free( ((*fptr)->Fptr)->filename);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* mem for file I/O buffers */
    ((*fptr)->Fptr)->iobuffer = (char *) calloc(NIOBUF, IOBUFLEN);

    if ( !(((*fptr)->Fptr)->iobuffer) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for iobuffer array: (ffomem)");
        ffpmsg(url);
        free( ((*fptr)->Fptr)->headstart);    /* free memory for headstart array */
        free( ((*fptr)->Fptr)->filename);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* initialize the ageindex array (relative age of the I/O buffers) */
    /* and initialize the bufrecnum array as being empty */
    for (ii = 0; ii < NIOBUF; ii++)  {
        ((*fptr)->Fptr)->ageindex[ii] = ii;
        ((*fptr)->Fptr)->bufrecnum[ii] = -1;
    }

        /* store the parameters describing the file */
    ((*fptr)->Fptr)->MAXHDU = 1000;              /* initial size of headstart */
    ((*fptr)->Fptr)->filehandle = handle;        /* file handle */
    ((*fptr)->Fptr)->driver = driver;            /* driver number */
    strcpy(((*fptr)->Fptr)->filename, url);      /* full input filename */
    ((*fptr)->Fptr)->filesize = filesize;        /* physical file size */
    ((*fptr)->Fptr)->logfilesize = filesize;     /* logical file size */
    ((*fptr)->Fptr)->writemode = mode;      /* read-write mode    */
    ((*fptr)->Fptr)->datastart = DATA_UNDEFINED; /* unknown start of data */
    ((*fptr)->Fptr)->curbuf = -1;             /* undefined current IO buffer */
    ((*fptr)->Fptr)->open_count = 1;     /* structure is currently used once */
    ((*fptr)->Fptr)->validcode = VALIDSTRUC; /* flag denoting valid structure */
    ((*fptr)->Fptr)->noextsyntax = 0;  /* extended syntax can be used in filename */

    ffldrc(*fptr, 0, REPORT_EOF, status);     /* load first record */

    fits_store_Fptr( (*fptr)->Fptr, status);  /* store Fptr address */

    if (ffrhdu(*fptr, &hdutyp, status) > 0)  /* determine HDU structure */
    {
        ffpmsg(
          "ffomem could not interpret primary array header of file: (ffomem)");
        ffpmsg(url);

        if (*status == UNKNOWN_REC)
           ffpmsg("This does not look like a FITS file.");

        ffclos(*fptr, status);
        *fptr = 0;              /* return null file pointer */
    }

    /* ---------------------------------------------------------- */
    /* move to desired extension, if specified as part of the URL */
    /* ---------------------------------------------------------- */

    imagecolname[0] = '\0';
    rowexpress[0] = '\0';

    if (*extspec)
    {
       /* parse the extension specifier into individual parameters */
       ffexts(extspec, &extnum, 
         extname, &extvers, &movetotype, imagecolname, rowexpress, status);


      if (*status > 0)
          return(*status);

      if (extnum)
      {
        ffmahd(*fptr, extnum + 1, &hdutyp, status);
      }
      else if (*extname) /* move to named extension, if specified */
      {
        ffmnhd(*fptr, movetotype, extname, extvers, status);
      }

      if (*status > 0)
      {
        ffpmsg("ffomem could not move to the specified extension:");
        if (extnum > 0)
        {
          snprintf(errmsg, FLEN_ERRMSG,
          " extension number %d doesn't exist or couldn't be opened.",extnum);
          ffpmsg(errmsg);
        }
        else
        {
          snprintf(errmsg, FLEN_ERRMSG,
          " extension with EXTNAME = %s,", extname);
          ffpmsg(errmsg);

          if (extvers)
          {
             snprintf(errmsg, FLEN_ERRMSG,
             "           and with EXTVERS = %d,", extvers);
             ffpmsg(errmsg);
          }

          if (movetotype != ANY_HDU)
          {
             snprintf(errmsg, FLEN_ERRMSG,
             "           and with XTENSION = %s,", hdtype[movetotype]);
             ffpmsg(errmsg);
          }

          ffpmsg(" doesn't exist or couldn't be opened.");
        }
        return(*status);
      }
    }

    return(*status);
}